

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O0

void SoPlex_addColReal(void *soplex,double *colentries,int colsize,int nnonzeros,double objval,
                      double lb,double ub)

{
  double dVar1;
  int in_EDX;
  long in_RSI;
  DSVectorBase<double> *in_RDI;
  LPColBase<double> *in_stack_00000058;
  int i;
  DSVector col;
  SoPlex *so;
  double *in_stack_ffffffffffffff48;
  double *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  LPColBase<double> *in_stack_ffffffffffffff60;
  undefined4 local_5c;
  
  ::soplex::DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  for (local_5c = 0; local_5c < in_EDX; local_5c = local_5c + 1) {
    dVar1 = *(double *)(in_RSI + (long)local_5c * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      ::soplex::DSVectorBase<double>::add
                ((DSVectorBase<double> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                 in_stack_ffffffffffffff50);
    }
  }
  ::soplex::LPColBase<double>::LPColBase
            (in_stack_ffffffffffffff60,
             (double *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (SVectorBase<double> *)in_RDI,in_stack_ffffffffffffff48,(double *)0x1a3efc);
  ::soplex::SoPlexBase<double>::addColReal
            ((SoPlexBase<double> *)col._vptr_DSVectorBase,in_stack_00000058);
  ::soplex::LPColBase<double>::~LPColBase((LPColBase<double> *)0x1a3f19);
  ::soplex::DSVectorBase<double>::~DSVectorBase(in_RDI);
  return;
}

Assistant:

void SoPlex_addColReal(void* soplex, double* colentries, int colsize, int nnonzeros, double objval,
                       double lb, double ub)
{
   SoPlex* so = (SoPlex*)(soplex);
   DSVector col(nnonzeros);

   /* add nonzero entries to column vector */
   for(int i = 0; i < colsize; ++i)
   {
      if(colentries[i] != 0.0)
         col.add(i, colentries[i]);
   }

   so->addColReal(LPCol(objval, col, ub, lb));
}